

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGL3DriverBase::updateHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink *HWBuffer)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  long in_RSI;
  SHWBufferLink_opengl *unaff_retaddr;
  COpenGL3DriverBase *in_stack_00000008;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    if ((*(int *)(in_RSI + 0x18) != 0) &&
       ((iVar1 = *(int *)(in_RSI + 0x10), iVar3 = (**(code **)(**(long **)(in_RSI + 8) + 0xc0))(),
        iVar1 != iVar3 || (*(int *)(in_RSI + 0x28) == 0)))) {
      uVar4 = (**(code **)(**(long **)(in_RSI + 8) + 0xc0))();
      *(undefined4 *)(in_RSI + 0x10) = uVar4;
      bVar2 = updateVertexHardwareBuffer(this,(SHWBufferLink_opengl *)HWBuffer);
      if (!bVar2) {
        return false;
      }
    }
    if ((*(int *)(in_RSI + 0x1c) != 0) &&
       ((iVar1 = *(int *)(in_RSI + 0x14), iVar3 = (**(code **)(**(long **)(in_RSI + 8) + 200))(),
        iVar1 != iVar3 || (*(int *)(in_RSI + 0x2c) == 0)))) {
      uVar4 = (**(code **)(**(long **)(in_RSI + 8) + 200))();
      *(undefined4 *)(in_RSI + 0x14) = uVar4;
      bVar2 = updateIndexHardwareBuffer(in_stack_00000008,unaff_retaddr);
      if (!bVar2) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool COpenGL3DriverBase::updateHardwareBuffer(SHWBufferLink *HWBuffer)
{
	if (!HWBuffer)
		return false;

	if (HWBuffer->Mapped_Vertex != scene::EHM_NEVER) {
		if (HWBuffer->ChangedID_Vertex != HWBuffer->MeshBuffer->getChangedID_Vertex() || !static_cast<SHWBufferLink_opengl *>(HWBuffer)->vbo_verticesID) {

			HWBuffer->ChangedID_Vertex = HWBuffer->MeshBuffer->getChangedID_Vertex();

			if (!updateVertexHardwareBuffer(static_cast<SHWBufferLink_opengl *>(HWBuffer)))
				return false;
		}
	}

	if (HWBuffer->Mapped_Index != scene::EHM_NEVER) {
		if (HWBuffer->ChangedID_Index != HWBuffer->MeshBuffer->getChangedID_Index() || !static_cast<SHWBufferLink_opengl *>(HWBuffer)->vbo_indicesID) {

			HWBuffer->ChangedID_Index = HWBuffer->MeshBuffer->getChangedID_Index();

			if (!updateIndexHardwareBuffer((SHWBufferLink_opengl *)HWBuffer))
				return false;
		}
	}

	return true;
}